

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O1

void __thiscall RGBColorSpace_sRGB_Test::TestBody(RGBColorSpace_sRGB_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  RGBColorSpace *this_00;
  bool bVar12;
  char *pcVar13;
  undefined1 auVar14 [16];
  undefined8 uVar24;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  RGB RVar25;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  undefined1 local_40 [12];
  undefined4 uStack_34;
  Float local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  
  this_00 = pbrt::RGBColorSpace::sRGB;
  uVar24 = 0;
  local_40._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_40._8_4_ = 0.0;
  RVar25 = pbrt::RGBColorSpace::ToRGB(pbrt::RGBColorSpace::sRGB,(XYZ *)local_40);
  local_2c = RVar25.b;
  local_28 = RVar25._0_8_;
  auVar14._8_8_ = 0x7fffffffffffffff;
  auVar14._0_8_ = 0x7fffffffffffffff;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = 3.2406 - (double)RVar25.r;
  auVar14 = vandpd_avx512vl(auVar15,auVar14);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  uStack_20 = uVar24;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(3.2406 - rgb[0])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x21,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar9._8_8_ = uStack_20;
  auVar9._0_8_ = local_28;
  auVar14 = vmovshdup_avx(auVar9);
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = -0.9689 - (double)auVar14._0_4_;
  auVar14 = vandpd_avx512vl(auVar16,auVar1);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(-.9689 - rgb[1])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x22,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar2._8_8_ = 0x7fffffffffffffff;
  auVar2._0_8_ = 0x7fffffffffffffff;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = 0.0557 - (double)local_2c;
  auVar14 = vandpd_avx512vl(auVar17,auVar2);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(.0557 - rgb[2])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x23,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar24 = 0;
  local_40._0_4_ = 0.0;
  local_40._4_4_ = 1.0;
  local_40._8_4_ = 0.0;
  RVar25 = pbrt::RGBColorSpace::ToRGB(this_00,(XYZ *)local_40);
  local_2c = RVar25.b;
  local_28 = RVar25._0_8_;
  auVar3._8_8_ = 0x7fffffffffffffff;
  auVar3._0_8_ = 0x7fffffffffffffff;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -1.5372 - (double)RVar25.r;
  auVar14 = vandpd_avx512vl(auVar18,auVar3);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  uStack_20 = uVar24;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(-1.5372 - rgb[0])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x26,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar10._8_8_ = uStack_20;
  auVar10._0_8_ = local_28;
  auVar14 = vmovshdup_avx(auVar10);
  auVar4._8_8_ = 0x7fffffffffffffff;
  auVar4._0_8_ = 0x7fffffffffffffff;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = 1.8758 - (double)auVar14._0_4_;
  auVar14 = vandpd_avx512vl(auVar19,auVar4);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(1.8758 - rgb[1])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x27,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar5._8_8_ = 0x7fffffffffffffff;
  auVar5._0_8_ = 0x7fffffffffffffff;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = -0.204 - (double)local_2c;
  auVar14 = vandpd_avx512vl(auVar20,auVar5);
  uVar24 = auVar14._8_8_;
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(-.2040 - rgb[2])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x28,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
        uVar24 = extraout_XMM0_Qb;
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_40._0_4_ = 0.0;
  local_40._4_4_ = 0.0;
  local_40._8_4_ = 1.0;
  RVar25 = pbrt::RGBColorSpace::ToRGB(this_00,(XYZ *)local_40);
  local_2c = RVar25.b;
  local_28 = RVar25._0_8_;
  auVar6._8_8_ = 0x7fffffffffffffff;
  auVar6._0_8_ = 0x7fffffffffffffff;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -0.4986 - (double)RVar25.r;
  auVar14 = vandpd_avx512vl(auVar21,auVar6);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  uStack_20 = uVar24;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(-.4986 - rgb[0])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x2b,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar11._8_8_ = uStack_20;
  auVar11._0_8_ = local_28;
  auVar14 = vmovshdup_avx(auVar11);
  auVar7._8_8_ = 0x7fffffffffffffff;
  auVar7._0_8_ = 0x7fffffffffffffff;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = 0.0415 - (double)auVar14._0_4_;
  auVar14 = vandpd_avx512vl(auVar22,auVar7);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(.0415 - rgb[1])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x2c,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar8._8_8_ = 0x7fffffffffffffff;
  auVar8._0_8_ = 0x7fffffffffffffff;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = 1.057 - (double)local_2c;
  auVar14 = vandpd_avx512vl(auVar23,auVar8);
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar14);
  local_48.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_40,"std::abs(1.0570 - rgb[2])","1e-3",(double *)&local_50,
             (double *)&local_48);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(uStack_34,local_40._8_4_) == (undefined8 *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)CONCAT44(uStack_34,local_40._8_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/color_test.cpp"
               ,0x2d,pcVar13);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(RGBColorSpace, sRGB) {
    const RGBColorSpace &sRGB = *RGBColorSpace::sRGB;

    // Make sure the matrix values are sensible by throwing the x, y, and z
    // basis vectors at it to pull out columns.
    RGB rgb = sRGB.ToRGB({1, 0, 0});
    EXPECT_LT(std::abs(3.2406 - rgb[0]), 1e-3);
    EXPECT_LT(std::abs(-.9689 - rgb[1]), 1e-3);
    EXPECT_LT(std::abs(.0557 - rgb[2]), 1e-3);

    rgb = sRGB.ToRGB({0, 1, 0});
    EXPECT_LT(std::abs(-1.5372 - rgb[0]), 1e-3);
    EXPECT_LT(std::abs(1.8758 - rgb[1]), 1e-3);
    EXPECT_LT(std::abs(-.2040 - rgb[2]), 1e-3);

    rgb = sRGB.ToRGB({0, 0, 1});
    EXPECT_LT(std::abs(-.4986 - rgb[0]), 1e-3);
    EXPECT_LT(std::abs(.0415 - rgb[1]), 1e-3);
    EXPECT_LT(std::abs(1.0570 - rgb[2]), 1e-3);
}